

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O2

bool __thiscall SQClass::Get(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQClassMember *pSVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  SQObject local_28;
  
  bVar2 = SQTable::Get(this->_members,key,val);
  if (bVar2) {
    uVar3 = SUB84((val->super_SQObject)._unVal,0);
    uVar5 = uVar3 & 0xffffff;
    if ((uVar3 >> 0x19 & 1) == 0) {
      SQObjectPtr::operator=
                (val,(SQObjectPtr *)
                     ((long)&(((this->_methods)._vals)->val).super_SQObject._type +
                     (ulong)(uVar5 << 5)));
    }
    else {
      pSVar1 = (this->_defaultvalues)._vals;
      uVar6 = (ulong)(uVar5 << 5);
      puVar4 = (undefined8 *)((long)&(pSVar1->val).super_SQObject._type + uVar6);
      if (*(int *)((long)&(pSVar1->val).super_SQObject._type + uVar6) == 0x8010000) {
        puVar4 = (undefined8 *)(puVar4[1] + 0x18);
      }
      local_28._0_8_ = *puVar4;
      local_28._unVal = *(SQObjectValue *)(puVar4 + 1);
      SQObjectPtr::operator=(val,&local_28);
    }
  }
  return bVar2;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val) {
        if(_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _defaultvalues[_member_idx(val)].val;
                val = _realval(o);
            }
            else {
                val = _methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }